

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void cli::cleanPath(string *path)

{
  bool bVar1;
  reference pcVar2;
  char *pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator it;
  string *path_local;
  
  it._M_current = (char *)path;
  local_18._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_20._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    if (*pcVar2 == '\\') {
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_18);
      *pcVar2 = '/';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_18);
  }
  pcVar3 = (char *)std::__cxx11::string::back();
  if (*pcVar3 == '*') {
    std::__cxx11::string::pop_back();
  }
  pcVar3 = (char *)std::__cxx11::string::back();
  if (*pcVar3 == '/') {
    std::__cxx11::string::pop_back();
  }
  return;
}

Assistant:

void cleanPath(std::string &path)
	{
		for (std::string::iterator it = path.begin(); it != path.end(); ++it)
		{
			if ((*it) == '\\')
				(*it) = '/';
		}

		if (path.back() == '*')
			path.pop_back();
		if (path.back() == '/')
			path.pop_back();
	}